

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanscalar.cpp
# Opt level: O3

string * __thiscall
YAML::ScanScalar_abi_cxx11_
          (string *__return_storage_ptr__,YAML *this,Stream *INPUT,ScanScalarParams *params)

{
  CharacterSet CVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  RegEx *pRVar7;
  undefined7 extraout_var;
  RegEx *pRVar8;
  RegEx *ex2;
  undefined4 extraout_var_00;
  ulong uVar9;
  Exception *pEVar10;
  ulong uVar11;
  size_type sVar12;
  pointer pcVar13;
  Stream *in;
  ulong uVar14;
  uint uVar15;
  char cVar16;
  byte local_9b;
  byte local_9a;
  bool local_99;
  string local_90;
  ulong local_70;
  ulong local_68;
  RegEx *local_60;
  Mark local_58;
  ulong local_48;
  undefined4 local_3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  uVar14 = (ulong)(INPUT->m_charSet == utf16be);
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  *(undefined1 *)
   &(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = 0;
  if (INPUT->m_input != (istream *)0x0) goto LAB_00714bb6;
  if (Exp::Empty()::e == '\0') goto LAB_007155d3;
LAB_00714bac:
  INPUT->m_input = (istream *)Exp::Empty()::e;
LAB_00714bb6:
  local_68 = 0;
  local_70 = 0xffffffffffffffff;
  local_48 = 0;
  pRVar8 = (RegEx *)0x0;
  bVar2 = false;
  pRVar7 = (RegEx *)0x0;
LAB_00714bdd:
  local_9b = (byte)uVar14;
  local_9a = (byte)pRVar7;
  local_99 = SUB81(pRVar8,0);
LAB_00714beb:
  bVar3 = Stream::operator_cast_to_bool((Stream *)this);
  cVar16 = (char)__return_storage_ptr__;
  if (!bVar3) goto LAB_007153a6;
  uVar14 = __return_storage_ptr__->_M_string_length;
  while( true ) {
    local_90._M_dataplus._M_p = (pointer)0x0;
    local_90._M_string_length = (size_type)this;
    iVar5 = RegEx::Match<YAML::StreamCharSource>
                      ((RegEx *)INPUT->m_input,(StreamCharSource *)&local_90);
    if (-1 < iVar5) break;
    pRVar7 = Exp::Break();
    local_90._M_dataplus._M_p = (pointer)0x0;
    local_90._M_string_length = (size_type)this;
    iVar5 = RegEx::Match<YAML::StreamCharSource>(pRVar7,(StreamCharSource *)&local_90);
    if ((-1 < iVar5) || (bVar3 = Stream::operator_cast_to_bool((Stream *)this), !bVar3)) break;
    if (*(int *)(this + 0x10) == 0) {
      if ((Exp::DocIndicator()::e == '\0') &&
         (iVar5 = __cxa_guard_acquire(&Exp::DocIndicator()::e), iVar5 != 0)) {
        pRVar8 = Exp::DocStart();
        pRVar7 = Exp::DocEnd();
        operator|((RegEx *)Exp::DocIndicator()::e,pRVar8,pRVar7);
        __cxa_atexit(RegEx::~RegEx,Exp::DocIndicator()::e,&__dso_handle);
        __cxa_guard_release(&Exp::DocIndicator()::e);
      }
      local_90._M_dataplus._M_p = (pointer)0x0;
      local_90._M_string_length = (size_type)this;
      iVar5 = RegEx::Match<YAML::StreamCharSource>
                        ((RegEx *)Exp::DocIndicator()::e,(StreamCharSource *)&local_90);
      if (-1 < iVar5) {
        iVar5 = (int)(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                     super__Deque_impl_data._M_map_size;
        if (iVar5 == 1) break;
        if (iVar5 == 2) {
          pEVar10 = (Exception *)__cxa_allocate_exception(0x40);
          local_58._0_8_ = *(undefined8 *)(this + 8);
          local_58.column = *(int *)(this + 0x10);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_90,"illegal document indicator in scalar","");
          Exception::Exception(pEVar10,&local_58,&local_90);
          *(undefined ***)pEVar10 = &PTR__BadFile_008779d0;
          __cxa_throw(pEVar10,&ParserException::typeinfo,BadFile::~BadFile);
        }
      }
    }
    if (*(char *)((long)&(INPUT->m_mark).column + 2) == '\\') {
      pRVar7 = Exp::EscBreak();
      local_90._M_dataplus._M_p = (pointer)0x0;
      local_90._M_string_length = (size_type)this;
      iVar5 = RegEx::Match<YAML::StreamCharSource>(pRVar7,(StreamCharSource *)&local_90);
      if (-1 < iVar5) {
        Stream::get((Stream *)this);
        uVar14 = __return_storage_ptr__->_M_string_length;
        pRVar7 = (RegEx *)CONCAT71((int7)((ulong)pRVar8 >> 8),1);
        local_9b = 1;
        bVar2 = true;
        local_70 = uVar14;
        goto LAB_00714de0;
      }
    }
    cVar4 = Stream::peek((Stream *)this);
    if (cVar4 == *(char *)((long)&(INPUT->m_mark).column + 2)) {
      Exp::Escape_abi_cxx11_(&local_90,(Exp *)this,in);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      uVar14 = __return_storage_ptr__->_M_string_length;
      local_9b = 1;
      bVar2 = true;
      local_70 = uVar14;
    }
    else {
      cVar4 = Stream::get((Stream *)this);
      pRVar8 = (RegEx *)(CONCAT71(extraout_var,cVar4) & 0xffffffff);
      std::__cxx11::string::push_back(cVar16);
      local_9b = 1;
      bVar2 = true;
      if (((char)pRVar8 != '\t') && (bVar2 = true, cVar4 != ' ')) {
        uVar14 = __return_storage_ptr__->_M_string_length;
        local_9b = 1;
        bVar2 = true;
      }
    }
  }
  pRVar7 = (RegEx *)0x0;
LAB_00714de0:
  bVar3 = Stream::operator_cast_to_bool((Stream *)this);
  if (!bVar3) {
    if ((char)(INPUT->m_mark).pos == '\x01') {
      pEVar10 = (Exception *)__cxa_allocate_exception(0x40);
      local_58._0_8_ = *(undefined8 *)(this + 8);
      local_58.column = *(int *)(this + 0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"illegal EOF in scalar","");
      Exception::Exception(pEVar10,&local_58,&local_90);
      *(undefined ***)pEVar10 = &PTR__BadFile_008779d0;
      __cxa_throw(pEVar10,&ParserException::typeinfo,BadFile::~BadFile);
    }
    goto LAB_007153a6;
  }
  if (((int)(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_map_size == 1) && (*(int *)(this + 0x10) == 0)) {
    if ((Exp::DocIndicator()::e == '\0') &&
       (iVar5 = __cxa_guard_acquire(&Exp::DocIndicator()::e), iVar5 != 0)) {
      local_60 = Exp::DocStart();
      pRVar8 = Exp::DocEnd();
      operator|((RegEx *)Exp::DocIndicator()::e,local_60,pRVar8);
      __cxa_atexit(RegEx::~RegEx,Exp::DocIndicator()::e,&__dso_handle);
      __cxa_guard_release(&Exp::DocIndicator()::e);
    }
    local_90._M_dataplus._M_p = (pointer)0x0;
    local_90._M_string_length = (size_type)this;
    iVar5 = RegEx::Match<YAML::StreamCharSource>
                      ((RegEx *)Exp::DocIndicator()::e,(StreamCharSource *)&local_90);
    if (-1 < iVar5) goto LAB_007153a6;
  }
  local_90._M_dataplus._M_p = (pointer)0x0;
  local_90._M_string_length = (size_type)this;
  iVar5 = RegEx::Match<YAML::StreamCharSource>
                    ((RegEx *)INPUT->m_input,(StreamCharSource *)&local_90);
  if (-1 < iVar5) {
    if ((char)(INPUT->m_mark).pos == '\x01') {
      Stream::eat((Stream *)this,iVar5);
    }
    goto LAB_007153a6;
  }
  if (INPUT->m_charSet == utf16be) {
    if (__return_storage_ptr__->_M_string_length < uVar14) goto LAB_007155bb;
    __return_storage_ptr__->_M_string_length = uVar14;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar14] = '\0';
  }
  pRVar8 = Exp::Break();
  local_90._M_dataplus._M_p = (pointer)0x0;
  local_90._M_string_length = (size_type)this;
  iVar5 = RegEx::Match<YAML::StreamCharSource>(pRVar8,(StreamCharSource *)&local_90);
  Stream::eat((Stream *)this,iVar5);
  while ((cVar4 = Stream::peek((Stream *)this), cVar4 == ' ' &&
         ((*(int *)(this + 0x10) < (INPUT->m_mark).line ||
          (((char)(INPUT->m_mark).column == '\x01' && (!bVar2))))))) {
    local_90._M_dataplus._M_p = (pointer)0x0;
    local_90._M_string_length = (size_type)this;
    iVar5 = RegEx::Match<YAML::StreamCharSource>
                      ((RegEx *)INPUT->m_input,(StreamCharSource *)&local_90);
    if (-1 < iVar5) break;
    Stream::eat((Stream *)this,1);
  }
  if (((char)(INPUT->m_mark).column == '\x01') && (!bVar2)) {
    iVar5 = (INPUT->m_mark).line;
    iVar6 = *(int *)(this + 0x10);
    if (*(int *)(this + 0x10) < iVar5) {
      iVar6 = iVar5;
    }
    (INPUT->m_mark).line = iVar6;
  }
  while( true ) {
    if ((Exp::Blank()::e == '\0') && (iVar5 = __cxa_guard_acquire(&Exp::Blank()::e), iVar5 != 0)) {
      pRVar8 = Exp::Space();
      ex2 = Exp::Tab();
      operator|(&Exp::Blank::e,pRVar8,ex2);
      __cxa_atexit(RegEx::~RegEx,&Exp::Blank::e,&__dso_handle);
      __cxa_guard_release(&Exp::Blank()::e);
    }
    local_90._M_dataplus._M_p = (pointer)0x0;
    local_90._M_string_length = (size_type)this;
    iVar5 = RegEx::Match<YAML::StreamCharSource>(&Exp::Blank::e,(StreamCharSource *)&local_90);
    if (iVar5 < 0) break;
    cVar4 = Stream::peek((Stream *)this);
    if (((cVar4 == '\t') && (*(int *)(this + 0x10) < (INPUT->m_mark).line)) &&
       (*(int *)((long)&(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                        super__Deque_impl_data._M_map_size + 4) == 2)) {
      pEVar10 = (Exception *)__cxa_allocate_exception(0x40);
      local_58._0_8_ = *(undefined8 *)(this + 8);
      local_58.column = *(int *)(this + 0x10);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"illegal tab when looking for indentation","");
      Exception::Exception(pEVar10,&local_58,&local_90);
      *(undefined ***)pEVar10 = &PTR__BadFile_008779d0;
      __cxa_throw(pEVar10,&ParserException::typeinfo,BadFile::~BadFile);
    }
    if (*(char *)((long)&(INPUT->m_mark).column + 1) != '\x01') break;
    local_90._M_dataplus._M_p = (pointer)0x0;
    local_90._M_string_length = (size_type)this;
    iVar5 = RegEx::Match<YAML::StreamCharSource>
                      ((RegEx *)INPUT->m_input,(StreamCharSource *)&local_90);
    if (-1 < iVar5) break;
    Stream::eat((Stream *)this,1);
  }
  pRVar8 = Exp::Break();
  local_90._M_dataplus._M_p = (pointer)0x0;
  local_90._M_string_length = (size_type)this;
  iVar5 = RegEx::Match<YAML::StreamCharSource>(pRVar8,(StreamCharSource *)&local_90);
  local_3c = SUB84(pRVar7,0);
  local_60 = (RegEx *)CONCAT71((int7)(CONCAT44(extraout_var_00,iVar5) >> 8),-1 < iVar5);
  if ((Exp::Blank()::e == '\0') && (iVar6 = __cxa_guard_acquire(&Exp::Blank()::e), iVar6 != 0)) {
    pRVar7 = Exp::Space();
    pRVar8 = Exp::Tab();
    operator|(&Exp::Blank::e,pRVar7,pRVar8);
    __cxa_atexit(RegEx::~RegEx,&Exp::Blank::e,&__dso_handle);
    __cxa_guard_release(&Exp::Blank()::e);
  }
  local_90._M_dataplus._M_p = (pointer)0x0;
  local_90._M_string_length = (size_type)this;
  iVar6 = RegEx::Match<YAML::StreamCharSource>(&Exp::Blank::e,(StreamCharSource *)&local_90);
  bVar3 = -1 < iVar6;
  pRVar8 = (RegEx *)CONCAT71((int7)((ulong)pRVar7 >> 8),bVar3);
  CVar1 = INPUT->m_charSet;
  uVar15 = (uint)local_99;
  if (CVar1 != utf16le || (int)local_68 != 0) {
    uVar15 = (uint)(byte)local_48;
  }
  if (iVar5 < 0) {
    uVar15 = (uint)(byte)local_48;
  }
  local_48 = (ulong)uVar15;
  if ((local_9b & 1) != 0) {
    if (CVar1 == utf8) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (CVar1 == utf16be) {
        if (iVar5 < 0) {
          if ((((byte)local_3c | local_9a) & 1) == 0) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          goto LAB_007152db;
        }
        local_9b = 1;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        local_9a = (byte)local_60;
        local_99 = bVar3;
        goto LAB_00714beb;
      }
      if (CVar1 == utf16le) {
        if ((((-1 < iVar5 || (local_9a & 1) != 0) || (-1 < iVar6)) || (local_99 != false)) &&
           (-1 < iVar5)) {
          local_68 = (ulong)((int)local_68 + 1);
          uVar14 = 1;
          pRVar7 = local_60;
          goto LAB_00714bdd;
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (0 < (int)local_68) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_90,(char)local_68 + -1);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if (((local_48 & 1) != 0) || ((bool)~bVar2 || bVar3)) {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          local_68 = 0;
        }
        goto LAB_007152db;
      }
    }
  }
  local_9b = 1;
  local_9a = (byte)local_60;
  local_99 = bVar3;
  if (iVar5 < 0) goto LAB_007152db;
  goto LAB_00714beb;
LAB_007155bb:
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar14);
LAB_007155d3:
  iVar5 = __cxa_guard_acquire(&Exp::Empty()::e);
  if (iVar5 != 0) {
    RegEx::RegEx((RegEx *)Exp::Empty()::e);
    __cxa_atexit(RegEx::~RegEx,Exp::Empty()::e,&__dso_handle);
    __cxa_guard_release(&Exp::Empty()::e);
  }
  goto LAB_00714bac;
LAB_007152db:
  uVar14 = 1;
  pRVar7 = local_60;
  if ((INPUT->m_mark).line <= *(int *)(this + 0x10)) goto LAB_00714bdd;
  *(undefined1 *)
   &(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = 1;
LAB_007153a6:
  uVar14 = local_70;
  if (*(char *)&(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                super__Deque_impl_data._M_map == '\x01') {
    uVar9 = std::__cxx11::string::find_last_not_of
                      ((char *)__return_storage_ptr__,0x75b942,0xffffffffffffffff);
    uVar11 = uVar14;
    if (uVar14 < uVar9) {
      uVar11 = uVar9;
    }
    if (uVar9 == 0xffffffffffffffff) {
      uVar11 = uVar14;
    }
    if (uVar14 == 0xffffffffffffffff) {
      uVar11 = uVar9;
    }
    if (uVar11 < __return_storage_ptr__->_M_string_length) {
      __return_storage_ptr__->_M_string_length = uVar11 + 1;
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar11 + 1] = '\0';
    }
  }
  iVar5 = *(int *)((long)&(INPUT->m_readahead).super__Deque_base<char,_std::allocator<char>_>.
                          _M_impl.super__Deque_impl_data._M_map + 4);
  if (iVar5 == -1) {
    uVar9 = std::__cxx11::string::find_last_not_of(cVar16,10);
    uVar11 = uVar14;
    if (uVar14 < uVar9) {
      uVar11 = uVar9;
    }
    if (uVar9 == 0xffffffffffffffff) {
      uVar11 = uVar14;
    }
    if (uVar14 == 0xffffffffffffffff) {
      uVar11 = uVar9;
    }
    if (uVar11 == 0xffffffffffffffff) goto LAB_007154a7;
    if (__return_storage_ptr__->_M_string_length <= uVar11) {
      return __return_storage_ptr__;
    }
    sVar12 = uVar11 + 1;
  }
  else {
    if (iVar5 != 0) {
      return __return_storage_ptr__;
    }
    uVar9 = std::__cxx11::string::find_last_not_of(cVar16,10);
    uVar11 = uVar14;
    if (uVar14 < uVar9) {
      uVar11 = uVar9;
    }
    if (uVar9 == 0xffffffffffffffff) {
      uVar11 = uVar14;
    }
    if (uVar14 == 0xffffffffffffffff) {
      uVar11 = uVar9;
    }
    if (uVar11 == 0xffffffffffffffff) {
LAB_007154a7:
      __return_storage_ptr__->_M_string_length = 0;
      pcVar13 = (__return_storage_ptr__->_M_dataplus)._M_p;
      goto LAB_007154b2;
    }
    if (__return_storage_ptr__->_M_string_length <= uVar11 + 1) {
      return __return_storage_ptr__;
    }
    sVar12 = uVar11 + 2;
  }
  __return_storage_ptr__->_M_string_length = sVar12;
  pcVar13 = (__return_storage_ptr__->_M_dataplus)._M_p + sVar12;
LAB_007154b2:
  *pcVar13 = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string ScanScalar(Stream& INPUT, ScanScalarParams& params) {
  bool foundNonEmptyLine = false;
  bool pastOpeningBreak = (params.fold == FOLD_FLOW);
  bool emptyLine = false, moreIndented = false;
  int foldedNewlineCount = 0;
  bool foldedNewlineStartedMoreIndented = false;
  std::size_t lastEscapedChar = std::string::npos;
  std::string scalar;
  params.leadingSpaces = false;

  if (!params.end) {
    params.end = &Exp::Empty();
  }

  while (INPUT) {
    // ********************************
    // Phase #1: scan until line ending

    std::size_t lastNonWhitespaceChar = scalar.size();
    bool escapedNewline = false;
    while (!params.end->Matches(INPUT) && !Exp::Break().Matches(INPUT)) {
      if (!INPUT) {
        break;
      }

      // document indicator?
      if (INPUT.column() == 0 && Exp::DocIndicator().Matches(INPUT)) {
        if (params.onDocIndicator == BREAK) {
          break;
        }
        if (params.onDocIndicator == THROW) {
          throw ParserException(INPUT.mark(), ErrorMsg::DOC_IN_SCALAR);
        }
      }

      foundNonEmptyLine = true;
      pastOpeningBreak = true;

      // escaped newline? (only if we're escaping on slash)
      if (params.escape == '\\' && Exp::EscBreak().Matches(INPUT)) {
        // eat escape character and get out (but preserve trailing whitespace!)
        INPUT.get();
        lastNonWhitespaceChar = scalar.size();
        lastEscapedChar = scalar.size();
        escapedNewline = true;
        break;
      }

      // escape this?
      if (INPUT.peek() == params.escape) {
        scalar += Exp::Escape(INPUT);
        lastNonWhitespaceChar = scalar.size();
        lastEscapedChar = scalar.size();
        continue;
      }

      // otherwise, just add the damn character
      char ch = INPUT.get();
      scalar += ch;
      if (ch != ' ' && ch != '\t') {
        lastNonWhitespaceChar = scalar.size();
      }
    }

    // eof? if we're looking to eat something, then we throw
    if (!INPUT) {
      if (params.eatEnd) {
        throw ParserException(INPUT.mark(), ErrorMsg::EOF_IN_SCALAR);
      }
      break;
    }

    // doc indicator?
    if (params.onDocIndicator == BREAK && INPUT.column() == 0 &&
        Exp::DocIndicator().Matches(INPUT)) {
      break;
    }

    // are we done via character match?
    int n = params.end->Match(INPUT);
    if (n >= 0) {
      if (params.eatEnd) {
        INPUT.eat(n);
      }
      break;
    }

    // do we remove trailing whitespace?
    if (params.fold == FOLD_FLOW)
      scalar.erase(lastNonWhitespaceChar);

    // ********************************
    // Phase #2: eat line ending
    n = Exp::Break().Match(INPUT);
    INPUT.eat(n);

    // ********************************
    // Phase #3: scan initial spaces

    // first the required indentation
    while (INPUT.peek() == ' ' &&
           (INPUT.column() < params.indent ||
            (params.detectIndent && !foundNonEmptyLine)) &&
           !params.end->Matches(INPUT)) {
      INPUT.eat(1);
    }

    // update indent if we're auto-detecting
    if (params.detectIndent && !foundNonEmptyLine) {
      params.indent = std::max(params.indent, INPUT.column());
    }

    // and then the rest of the whitespace
    while (Exp::Blank().Matches(INPUT)) {
      // we check for tabs that masquerade as indentation
      if (INPUT.peek() == '\t' && INPUT.column() < params.indent &&
          params.onTabInIndentation == THROW) {
        throw ParserException(INPUT.mark(), ErrorMsg::TAB_IN_INDENTATION);
      }

      if (!params.eatLeadingWhitespace) {
        break;
      }

      if (params.end->Matches(INPUT)) {
        break;
      }

      INPUT.eat(1);
    }

    // was this an empty line?
    bool nextEmptyLine = Exp::Break().Matches(INPUT);
    bool nextMoreIndented = Exp::Blank().Matches(INPUT);
    if (params.fold == FOLD_BLOCK && foldedNewlineCount == 0 && nextEmptyLine)
      foldedNewlineStartedMoreIndented = moreIndented;

    // for block scalars, we always start with a newline, so we should ignore it
    // (not fold or keep)
    if (pastOpeningBreak) {
      switch (params.fold) {
        case DONT_FOLD:
          scalar += "\n";
          break;
        case FOLD_BLOCK:
          if (!emptyLine && !nextEmptyLine && !moreIndented &&
              !nextMoreIndented && INPUT.column() >= params.indent) {
            scalar += " ";
          } else if (nextEmptyLine) {
            foldedNewlineCount++;
          } else {
            scalar += "\n";
          }

          if (!nextEmptyLine && foldedNewlineCount > 0) {
            scalar += std::string(foldedNewlineCount - 1, '\n');
            if (foldedNewlineStartedMoreIndented ||
                nextMoreIndented | !foundNonEmptyLine) {
              scalar += "\n";
            }
            foldedNewlineCount = 0;
          }
          break;
        case FOLD_FLOW:
          if (nextEmptyLine) {
            scalar += "\n";
          } else if (!emptyLine && !escapedNewline) {
            scalar += " ";
          }
          break;
      }
    }

    emptyLine = nextEmptyLine;
    moreIndented = nextMoreIndented;
    pastOpeningBreak = true;

    // are we done via indentation?
    if (!emptyLine && INPUT.column() < params.indent) {
      params.leadingSpaces = true;
      break;
    }
  }

  // post-processing
  if (params.trimTrailingSpaces) {
    std::size_t pos = scalar.find_last_not_of(" \t");
    if (lastEscapedChar != std::string::npos) {
      if (pos < lastEscapedChar || pos == std::string::npos) {
        pos = lastEscapedChar;
      }
    }
    if (pos < scalar.size()) {
      scalar.erase(pos + 1);
    }
  }

  switch (params.chomp) {
    case CLIP: {
      std::size_t pos = scalar.find_last_not_of('\n');
      if (lastEscapedChar != std::string::npos) {
        if (pos < lastEscapedChar || pos == std::string::npos) {
          pos = lastEscapedChar;
        }
      }
      if (pos == std::string::npos) {
        scalar.erase();
      } else if (pos + 1 < scalar.size()) {
        scalar.erase(pos + 2);
      }
    } break;
    case STRIP: {
      std::size_t pos = scalar.find_last_not_of('\n');
      if (lastEscapedChar != std::string::npos) {
        if (pos < lastEscapedChar || pos == std::string::npos) {
          pos = lastEscapedChar;
        }
      }
      if (pos == std::string::npos) {
        scalar.erase();
      } else if (pos < scalar.size()) {
        scalar.erase(pos + 1);
      }
    } break;
    default:
      break;
  }

  return scalar;
}